

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<vkb::Instance> * __thiscall
vkb::InstanceBuilder::build(Result<vkb::Instance> *__return_storage_ptr__,InstanceBuilder *this)

{
  uint uVar1;
  undefined4 uVar2;
  pointer ppcVar3;
  char *pcVar4;
  pointer pVVar5;
  pointer pVVar6;
  PFN_vkDebugUtilsMessengerCallbackEXT p_Var7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pVVar11;
  int iVar12;
  uint uVar13;
  VkResult VVar14;
  pointer ppVVar15;
  ulong uVar16;
  char **extension_name;
  char **ppcVar17;
  uint32_t uVar18;
  undefined1 uVar19;
  undefined8 unaff_R14;
  char **ext;
  pointer pVVar20;
  pointer ppcVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  uint32_t instance_version;
  vector<const_char_*,_std::allocator<const_char_*>_> layers;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> pNext_chain;
  SystemInfo system;
  VkInstanceCreateInfo instance_create_info;
  Instance instance;
  Result<vkb::SystemInfo> sys_info_ret;
  VkValidationFlagsEXT checks;
  VkValidationFeaturesEXT features;
  VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo;
  char **local_298;
  iterator iStack_290;
  char **local_288;
  uint local_27c;
  pointer local_278;
  uint local_270;
  uint32_t local_26c;
  char **local_268;
  iterator iStack_260;
  char **local_258;
  Result<vkb::Instance> *local_250;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> local_248;
  InstanceBuilder *local_228;
  pointer local_220;
  char **local_218;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> local_210;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_1f8;
  undefined8 local_1e0;
  VkInstanceCreateInfo local_1d8;
  VkInstance local_198;
  VkDebugUtilsMessengerEXT pVStack_190;
  VkAllocationCallbacks *local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined1 uStack_167;
  undefined6 uStack_166;
  VkApplicationInfo local_158;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  PFN_vkDebugUtilsMessengerCallbackEXT local_108;
  void *pvStack_100;
  undefined1 local_f8 [56];
  bool local_c0;
  VkBaseOutStructure local_b8;
  ulong local_a8;
  pointer pVStack_a0;
  VkBaseOutStructure local_98;
  ulong local_88;
  pointer pVStack_80;
  ulong local_78;
  pointer pVStack_70;
  VkBaseOutStructure local_68;
  long local_58;
  ulong uStack_50;
  PFN_vkDebugUtilsMessengerCallbackEXT local_48;
  void *pvStack_40;
  
  SystemInfo::get_system_info
            ((Result<vkb::SystemInfo> *)local_f8,(this->info).fp_vkGetInstanceProcAddr);
  if (local_c0 == false) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = local_f8._0_4_;
    (__return_storage_ptr__->field_0).m_value.debug_messenger =
         (VkDebugUtilsMessengerEXT)local_f8._8_8_;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
    goto LAB_0010566c;
  }
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
            (&local_210,(vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_f8);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            (&local_1f8,
             (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
             (local_f8 + 0x18));
  local_1e0 = local_f8._48_8_;
  local_27c = 0x400000;
  if (((this->info).minimum_instance_version < 0x400001) &&
     ((this->info).required_api_version < 0x400001)) {
LAB_001049cc:
    uVar13 = local_27c;
    if (0x400fff < local_27c) {
      uVar13 = (this->info).required_api_version;
    }
    local_158.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_158._4_4_ = 0;
    local_158.pNext = (void *)0x0;
    local_158.pApplicationName = (this->info).app_name;
    if (local_158.pApplicationName == (char *)0x0) {
      local_158.pApplicationName = "";
    }
    local_158._28_4_ = 0;
    local_158.applicationVersion = (this->info).application_version;
    local_158.pEngineName = (this->info).engine_name;
    if (local_158.pEngineName == (char *)0x0) {
      local_158.pEngineName = "";
    }
    local_158.apiVersion = uVar13;
    local_158.engineVersion = (this->info).engine_version;
    local_288 = (char **)0x0;
    local_298 = (char **)0x0;
    iStack_290._M_current = (char **)0x0;
    local_258 = (char **)0x0;
    local_268 = (char **)0x0;
    iStack_260._M_current = (char **)0x0;
    ppcVar21 = (this->info).extensions.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar3 = (this->info).extensions.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_250 = __return_storage_ptr__;
    if (ppcVar21 != ppcVar3) {
      do {
        if (iStack_290._M_current == local_288) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_298,iStack_290,
                     ppcVar21);
        }
        else {
          *iStack_290._M_current = *ppcVar21;
          iStack_290._M_current = iStack_290._M_current + 1;
        }
        ppcVar21 = ppcVar21 + 1;
      } while (ppcVar21 != ppcVar3);
    }
    if ((((this->info).debug_callback != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) &&
        ((this->info).use_debug_messenger == true)) && (local_1e0._1_1_ == '\x01')) {
      local_1d8._0_8_ = "VK_EXT_debug_utils";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_298,(char **)&local_1d8);
    }
    pVVar11 = local_1f8.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar20 = (pointer)local_1f8.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    if (uVar13 < 0x401000) {
      uVar16 = CONCAT71((int7)((ulong)unaff_R14 >> 8),
                        local_1f8.
                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        local_1f8.
                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      if (local_1f8.
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1f8.
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar12 = strcmp("VK_KHR_get_physical_device_properties2",
                        (local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start)->extensionName);
        while (iVar12 != 0) {
          pVVar20 = (pointer)&pVVar20->implementationVersion;
          uVar16 = CONCAT71((int7)(uVar16 >> 8),pVVar20 != (pointer)pVVar11);
          if (pVVar20 == (pointer)pVVar11) break;
          iVar12 = strcmp("VK_KHR_get_physical_device_properties2",(char *)pVVar20);
        }
      }
    }
    else {
      uVar16 = 0;
    }
    if ((char)uVar16 != '\0') {
      local_1d8._0_8_ = "VK_KHR_get_physical_device_properties2";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_298,(char **)&local_1d8);
    }
    pVVar11 = local_1f8.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar20 = (pointer)local_1f8.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    bVar22 = local_1f8.
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_1f8.
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (bVar22) {
      iVar12 = strcmp("VK_KHR_portability_enumeration",
                      (local_1f8.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start)->extensionName);
      while (iVar12 != 0) {
        pVVar20 = (pointer)&pVVar20->implementationVersion;
        bVar22 = pVVar20 != (pointer)pVVar11;
        if (pVVar20 == (pointer)pVVar11) break;
        iVar12 = strcmp("VK_KHR_portability_enumeration",(char *)pVVar20);
      }
    }
    if (bVar22) {
      local_1d8._0_8_ = "VK_KHR_portability_enumeration";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_298,(char **)&local_1d8);
    }
    pVVar11 = local_1f8.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar20 = (pointer)local_1f8.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    local_270 = (uint)uVar16;
    local_26c = uVar13;
    local_228 = this;
    if ((this->info).headless_context == false) {
      local_1d8._0_8_ = "VK_KHR_surface";
      bVar23 = local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar23) {
        iVar12 = strcmp("VK_KHR_surface",
                        (local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start)->extensionName);
        while (iVar12 != 0) {
          pVVar20 = (pointer)&pVVar20->implementationVersion;
          bVar23 = pVVar20 != (pointer)pVVar11;
          if (pVVar20 == (pointer)pVVar11) break;
          iVar12 = strcmp("VK_KHR_surface",(char *)pVVar20);
        }
      }
      if (bVar23 != false) {
        if (iStack_290._M_current == local_288) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_298,iStack_290,
                     (char **)&local_1d8);
        }
        else {
          *iStack_290._M_current = "VK_KHR_surface";
          iStack_290._M_current = iStack_290._M_current + 1;
        }
      }
      pVVar11 = local_1f8.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pVVar20 = (pointer)local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      local_278 = (pointer)CONCAT71(local_278._1_7_,bVar23);
      local_1d8._0_8_ = "VK_KHR_xcb_surface";
      bVar23 = local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar23) {
        iVar12 = strcmp("VK_KHR_xcb_surface",
                        (local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start)->extensionName);
        while (iVar12 != 0) {
          pVVar20 = (pointer)&pVVar20->implementationVersion;
          bVar23 = pVVar20 != (pointer)pVVar11;
          if (pVVar20 == (pointer)pVVar11) break;
          iVar12 = strcmp("VK_KHR_xcb_surface",(char *)pVVar20);
        }
      }
      if (bVar23 != false) {
        if (iStack_290._M_current == local_288) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_298,iStack_290,
                     (char **)&local_1d8);
        }
        else {
          *iStack_290._M_current = "VK_KHR_xcb_surface";
          iStack_290._M_current = iStack_290._M_current + 1;
        }
      }
      pVVar11 = local_1f8.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pVVar20 = (pointer)local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      local_1d8._0_8_ = "VK_KHR_xlib_surface";
      bVar24 = local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar24) {
        iVar12 = strcmp("VK_KHR_xlib_surface",
                        (local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start)->extensionName);
        while (iVar12 != 0) {
          pVVar20 = (pointer)&pVVar20->implementationVersion;
          bVar24 = pVVar20 != (pointer)pVVar11;
          if (pVVar20 == (pointer)pVVar11) break;
          iVar12 = strcmp("VK_KHR_xlib_surface",(char *)pVVar20);
        }
      }
      if (bVar24 != false) {
        if (iStack_290._M_current == local_288) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_298,iStack_290,
                     (char **)&local_1d8);
        }
        else {
          *iStack_290._M_current = "VK_KHR_xlib_surface";
          iStack_290._M_current = iStack_290._M_current + 1;
        }
      }
      pVVar11 = local_1f8.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pVVar20 = (pointer)local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      local_1d8._0_8_ = "VK_KHR_wayland_surface";
      bVar25 = local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar25) {
        iVar12 = strcmp("VK_KHR_wayland_surface",
                        (local_1f8.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start)->extensionName);
        while (iVar12 != 0) {
          pVVar20 = (pointer)&pVVar20->implementationVersion;
          bVar25 = pVVar20 != (pointer)pVVar11;
          if (pVVar20 == (pointer)pVVar11) break;
          iVar12 = strcmp("VK_KHR_wayland_surface",(char *)pVVar20);
        }
      }
      this = local_228;
      if (bVar25 != false) {
        if (iStack_290._M_current == local_288) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_298,iStack_290,
                     (char **)&local_1d8);
        }
        else {
          *iStack_290._M_current = "VK_KHR_wayland_surface";
          iStack_290._M_current = iStack_290._M_current + 1;
        }
      }
      uVar16 = (ulong)local_270;
      if (((byte)local_278 & (bVar23 | bVar24 | bVar25)) != 0) goto LAB_00104f66;
      (local_250->field_0).m_error.type._M_value = 10;
LAB_0010545d:
      (local_250->field_0).m_value.debug_messenger =
           (VkDebugUtilsMessengerEXT)&detail::instance_error_category;
      (local_250->field_0).m_error.vk_result = VK_SUCCESS;
      local_250->m_init = false;
      __return_storage_ptr__ = local_250;
    }
    else {
LAB_00104f66:
      uVar19 = (undefined1)uVar16;
      local_218 = iStack_290._M_current;
      if (local_298 != iStack_290._M_current) {
        bVar24 = local_1f8.
                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
                 local_1f8.
                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_278 = (pointer)local_1f8.
                             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                             ._M_impl.super__Vector_impl_data._M_start;
        local_220 = (pointer)((long)local_1f8.
                                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 0x104);
        bVar23 = true;
        ppcVar17 = local_298;
        do {
          pcVar4 = *ppcVar17;
          bVar25 = pcVar4 != (char *)0x0 &&
                   local_278 !=
                   (pointer)local_1f8.
                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          if (pcVar4 != (char *)0x0 &&
              local_278 !=
              (pointer)local_1f8.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
            iVar12 = strcmp(pcVar4,local_278->layerName);
            bVar25 = bVar24;
            for (pVVar20 = local_220;
                (iVar12 != 0 &&
                (bVar25 = pVVar20 !=
                          (pointer)local_1f8.
                                   super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_finish, bVar25));
                pVVar20 = (pointer)&pVVar20->implementationVersion) {
              iVar12 = strcmp(pcVar4,pVVar20->layerName);
            }
          }
          if (!bVar25) {
            bVar23 = false;
          }
          ppcVar17 = ppcVar17 + 1;
        } while (ppcVar17 != local_218);
        uVar19 = (undefined1)local_270;
        this = local_228;
        if (!bVar23) {
          (local_250->field_0).m_error.type._M_value = 9;
          goto LAB_0010545d;
        }
      }
      uVar18 = local_26c;
      ppcVar21 = (this->info).layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar3 = (this->info).layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar21 != ppcVar3) {
        do {
          if (iStack_260._M_current == local_258) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&local_268,iStack_260,
                       ppcVar21);
          }
          else {
            *iStack_260._M_current = *ppcVar21;
            iStack_260._M_current = iStack_260._M_current + 1;
          }
          ppcVar21 = ppcVar21 + 1;
        } while (ppcVar21 != ppcVar3);
      }
      if (((this->info).enable_validation_layers != false) ||
         (((this->info).request_validation_layers == true && ((char)local_1e0 == '\x01')))) {
        if (iStack_260._M_current == local_258) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_268,iStack_260,
                     &detail::validation_layer_name);
        }
        else {
          *iStack_260._M_current = detail::validation_layer_name;
          iStack_260._M_current = iStack_260._M_current + 1;
        }
      }
      local_218 = iStack_260._M_current;
      if (local_268 != iStack_260._M_current) {
        bVar24 = local_210.super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_210.super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_278 = local_210.
                    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_220 = local_210.
                    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
        bVar23 = true;
        ppcVar17 = local_268;
        do {
          pcVar4 = *ppcVar17;
          bVar25 = pcVar4 != (char *)0x0 &&
                   local_278 !=
                   local_210.
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          if (pcVar4 != (char *)0x0 &&
              local_278 !=
              local_210.super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            iVar12 = strcmp(pcVar4,local_278->layerName);
            bVar25 = bVar24;
            for (pVVar20 = local_220;
                (iVar12 != 0 &&
                (bVar25 = pVVar20 !=
                          local_210.
                          super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                          _M_impl.super__Vector_impl_data._M_finish, bVar25)); pVVar20 = pVVar20 + 1
                ) {
              iVar12 = strcmp(pcVar4,pVVar20->layerName);
            }
          }
          if (!bVar25) {
            bVar23 = false;
          }
          ppcVar17 = ppcVar17 + 1;
        } while (ppcVar17 != local_218);
        uVar19 = (undefined1)local_270;
        this = local_228;
        uVar18 = local_26c;
        if (!bVar23) {
          (local_250->field_0).m_error.type._M_value = 8;
          goto LAB_0010545d;
        }
      }
      local_248.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48 = (PFN_vkDebugUtilsMessengerCallbackEXT)0x0;
      pvStack_40 = (void *)0x0;
      local_58 = 0;
      uStack_50 = 0;
      local_68.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_68._4_4_ = 0;
      local_68.pNext = (VkBaseOutStructure *)0x0;
      if ((this->info).use_debug_messenger == true) {
        local_1d8._0_8_ = &local_68;
        local_68.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        local_68._4_4_ = 0;
        local_68.pNext = (VkBaseOutStructure *)0x0;
        local_58 = (ulong)(this->info).debug_message_severity << 0x20;
        uStack_50 = (ulong)(this->info).debug_message_type;
        local_48 = (this->info).debug_callback;
        pvStack_40 = (this->info).debug_user_data_pointer;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_248,
                   (VkBaseOutStructure **)&local_1d8);
      }
      local_78 = 0;
      pVStack_70 = (pointer)0x0;
      local_88 = 0;
      pVStack_80 = (pointer)0x0;
      local_98.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_98._4_4_ = 0;
      local_98.pNext = (VkBaseOutStructure *)0x0;
      pVVar5 = (this->info).enabled_validation_features.
               super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(this->info).enabled_validation_features.
                     super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5;
      if ((uVar16 != 0) ||
         ((this->info).disabled_validation_features.
          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->info).disabled_validation_features.
          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        local_1d8._0_8_ = &local_98;
        local_98.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
        local_98._4_4_ = 0;
        local_98.pNext = (VkBaseOutStructure *)0x0;
        local_88 = uVar16 >> 2 & 0xffffffff;
        pVStack_70 = (this->info).disabled_validation_features.
                     super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_78 = (ulong)((long)(this->info).disabled_validation_features.
                                 super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVStack_70) >> 2
                   & 0xffffffff;
        pVStack_80 = pVVar5;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_248,
                   (VkBaseOutStructure **)&local_1d8);
      }
      __return_storage_ptr__ = local_250;
      local_a8 = 0;
      pVStack_a0 = (pointer)0x0;
      local_b8.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_b8._4_4_ = 0;
      local_b8.pNext = (VkBaseOutStructure *)0x0;
      pVVar6 = (this->info).disabled_validation_checks.
               super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(this->info).disabled_validation_checks.
                     super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6;
      if (uVar16 != 0) {
        local_1d8._0_8_ = &local_b8;
        local_b8.sType = VK_STRUCTURE_TYPE_VALIDATION_FLAGS_EXT;
        local_b8._4_4_ = 0;
        local_b8.pNext = (VkBaseOutStructure *)0x0;
        local_a8 = uVar16 >> 2 & 0xffffffff;
        pVStack_a0 = pVVar6;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_248,
                   (VkBaseOutStructure **)&local_1d8);
      }
      local_1d8.pNext = (void *)0x0;
      local_1d8.enabledExtensionCount = 0;
      local_1d8._52_4_ = 0;
      local_1d8.ppEnabledExtensionNames = (char **)0x0;
      local_1d8.enabledLayerCount = 0;
      local_1d8._36_4_ = 0;
      local_1d8.ppEnabledLayerNames = (char **)0x0;
      local_1d8.flags = 0;
      local_1d8._20_4_ = 0;
      local_1d8.pApplicationInfo = (VkApplicationInfo *)0x0;
      local_1d8._0_8_ = (VkBaseOutStructure *)0x1;
      detail::setup_pNext_chain<VkInstanceCreateInfo>(&local_1d8,&local_248);
      for (ppVVar15 = local_248.
                      super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppVVar15 !=
          local_248.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppVVar15 = ppVVar15 + 1) {
        if ((*ppVVar15)->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
          __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                        "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                        ,0x2ee,"Result<Instance> vkb::InstanceBuilder::build() const");
        }
      }
      uVar13 = (this->info).flags;
      local_1d8.pApplicationInfo = &local_158;
      local_1d8.enabledExtensionCount =
           (uint32_t)((ulong)((long)iStack_290._M_current - (long)local_298) >> 3);
      local_1d8.ppEnabledExtensionNames = local_298;
      local_1d8.enabledLayerCount =
           (uint32_t)((ulong)((long)iStack_260._M_current - (long)local_268) >> 3);
      local_1d8.ppEnabledLayerNames = local_268;
      if (bVar22) {
        uVar13 = uVar13 | 1;
      }
      local_1d8.flags = uVar13;
      local_188 = (VkAllocationCallbacks *)0x0;
      uStack_180 = 0;
      local_198 = (VkInstance)0x0;
      pVStack_190 = (VkDebugUtilsMessengerEXT)0x0;
      local_178 = 0;
      local_170 = 0x40000000400000;
      local_168 = 0;
      uStack_167 = 0;
      VVar14 = (*(code *)detail::vulkan_functions()::v._88_8_)
                         (&local_1d8,(this->info).allocation_callbacks);
      if (VVar14 == VK_SUCCESS) {
        detail::VulkanFunctions::init_instance_funcs
                  ((VulkanFunctions *)detail::vulkan_functions()::v,local_198);
        if ((this->info).use_debug_messenger == true) {
          p_Var7 = (this->info).debug_callback;
          uVar2 = (this->info).debug_message_severity;
          uVar8 = (this->info).debug_message_type;
          pvStack_100 = (this->info).debug_user_data_pointer;
          local_108 = default_debug_callback;
          if (p_Var7 != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) {
            local_108 = p_Var7;
          }
          local_118 = 0;
          uStack_10c = 0;
          local_128 = 0x3b9cbe04;
          uStack_120 = 0;
          uStack_114 = uVar2;
          uStack_110 = uVar8;
          if (detail::vulkan_functions()::v._104_8_ == 0) {
            VVar14 = VK_ERROR_EXTENSION_NOT_PRESENT;
          }
          else {
            VVar14 = (*(code *)detail::vulkan_functions()::v._104_8_)
                               (local_198,&local_128,(this->info).allocation_callbacks,&pVStack_190)
            ;
          }
          if (VVar14 != VK_SUCCESS) {
            (__return_storage_ptr__->field_0).m_error.type._M_value = 7;
            goto LAB_0010543d;
          }
        }
        uVar10 = detail::vulkan_functions()::v._192_8_;
        uVar9 = detail::vulkan_functions()::v._48_8_;
        local_168 = (this->info).headless_context;
        local_188 = (this->info).allocation_callbacks;
        local_170 = CONCAT44(uVar18,local_27c);
        uStack_180 = detail::vulkan_functions()::v._48_8_;
        local_178 = detail::vulkan_functions()::v._192_8_;
        (__return_storage_ptr__->field_0).m_value.instance = local_198;
        (__return_storage_ptr__->field_0).m_value.debug_messenger = pVStack_190;
        *(ulong *)((long)&__return_storage_ptr__->field_0 + 0x30) =
             CONCAT62(uStack_166,CONCAT11(uVar19,local_168));
        (__return_storage_ptr__->field_0).m_value.allocation_callbacks = local_188;
        (__return_storage_ptr__->field_0).m_value.fp_vkGetInstanceProcAddr =
             (PFN_vkGetInstanceProcAddr)uVar9;
        (__return_storage_ptr__->field_0).m_value.fp_vkGetDeviceProcAddr =
             (PFN_vkGetDeviceProcAddr)uVar10;
        (__return_storage_ptr__->field_0).m_value.instance_version = local_27c;
        (__return_storage_ptr__->field_0).m_value.api_version = uVar18;
        bVar22 = true;
        uStack_167 = uVar19;
      }
      else {
        (__return_storage_ptr__->field_0).m_error.type._M_value = 6;
LAB_0010543d:
        (__return_storage_ptr__->field_0).m_value.debug_messenger =
             (VkDebugUtilsMessengerEXT)&detail::instance_error_category;
        (__return_storage_ptr__->field_0).m_error.vk_result = VVar14;
        bVar22 = false;
      }
      __return_storage_ptr__->m_init = bVar22;
      if (local_248.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_268 != (char **)0x0) {
      operator_delete(local_268,(long)local_258 - (long)local_268);
    }
    if (local_298 != (char **)0x0) {
      operator_delete(local_298,(long)local_288 - (long)local_298);
    }
  }
  else {
    if (detail::vulkan_functions()::v._80_8_ == 0) {
LAB_00104bb3:
      switch((this->info).required_api_version >> 0xc & 0x3ff) {
      case 0:
        goto switchD_00104bd6_caseD_0;
      default:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
        break;
      case 2:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
        break;
      case 3:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 4;
        break;
      case 4:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 5;
      }
    }
    else {
      iVar12 = (*(code *)detail::vulkan_functions()::v._80_8_)(&local_27c);
      uVar13 = (this->info).required_api_version;
      if (uVar13 == 0 || iVar12 == 0) {
        uVar1 = (this->info).minimum_instance_version;
        if ((uVar1 <= local_27c) && (uVar13 <= local_27c || uVar1 != 0)) goto LAB_001049cc;
        goto LAB_00104bb3;
      }
switchD_00104bd6_caseD_0:
      (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    }
    (__return_storage_ptr__->field_0).m_value.debug_messenger =
         (VkDebugUtilsMessengerEXT)&detail::instance_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  if ((pointer)local_1f8.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.
                    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_210.
                          super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.
                          super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010566c:
  Result<vkb::SystemInfo>::destroy((Result<vkb::SystemInfo> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

Result<Instance> InstanceBuilder::build() const {

    auto sys_info_ret = SystemInfo::get_system_info(info.fp_vkGetInstanceProcAddr);
    if (!sys_info_ret) return sys_info_ret.error();
    auto system = sys_info_ret.value();

    uint32_t instance_version = VKB_VK_API_VERSION_1_0;

    if (info.minimum_instance_version > VKB_VK_API_VERSION_1_0 || info.required_api_version > VKB_VK_API_VERSION_1_0) {
        PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion = detail::vulkan_functions().fp_vkEnumerateInstanceVersion;

        if (pfn_vkEnumerateInstanceVersion != nullptr) {
            VkResult res = pfn_vkEnumerateInstanceVersion(&instance_version);
            // Should always return VK_SUCCESS
            if (res != VK_SUCCESS && info.required_api_version > 0)
                return make_error_code(InstanceError::vulkan_version_unavailable);
        }
        if (pfn_vkEnumerateInstanceVersion == nullptr || instance_version < info.minimum_instance_version ||
            (info.minimum_instance_version == 0 && instance_version < info.required_api_version)) {
            if (VK_VERSION_MINOR(info.required_api_version) == 4)
                return make_error_code(InstanceError::vulkan_version_1_4_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version) == 3)
                return make_error_code(InstanceError::vulkan_version_1_3_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version) == 2)
                return make_error_code(InstanceError::vulkan_version_1_2_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version))
                return make_error_code(InstanceError::vulkan_version_1_1_unavailable);
            else
                return make_error_code(InstanceError::vulkan_version_unavailable);
        }
    }

    uint32_t api_version = instance_version < VKB_VK_API_VERSION_1_1 ? instance_version : info.required_api_version;

    VkApplicationInfo app_info = {};
    app_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    app_info.pNext = nullptr;
    app_info.pApplicationName = info.app_name != nullptr ? info.app_name : "";
    app_info.applicationVersion = info.application_version;
    app_info.pEngineName = info.engine_name != nullptr ? info.engine_name : "";
    app_info.engineVersion = info.engine_version;
    app_info.apiVersion = api_version;

    std::vector<const char*> extensions;
    std::vector<const char*> layers;

    for (auto& ext : info.extensions)
        extensions.push_back(ext);
    if (info.debug_callback != nullptr && info.use_debug_messenger && system.debug_utils_available) {
        extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
    }
    bool properties2_ext_enabled =
        api_version < VKB_VK_API_VERSION_1_1 && detail::check_extension_supported(system.available_extensions,
                                                    VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    if (properties2_ext_enabled) {
        extensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

#if defined(VK_KHR_portability_enumeration)
    bool portability_enumeration_support =
        detail::check_extension_supported(system.available_extensions, VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);
    if (portability_enumeration_support) {
        extensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);
    }
#else
    bool portability_enumeration_support = false;
#endif
    if (!info.headless_context) {
        auto check_add_window_ext = [&](const char* name) -> bool {
            if (!detail::check_extension_supported(system.available_extensions, name)) return false;
            extensions.push_back(name);
            return true;
        };
        bool khr_surface_added = check_add_window_ext("VK_KHR_surface");
#if defined(_WIN32)
        bool added_window_exts = check_add_window_ext("VK_KHR_win32_surface");
#elif defined(__ANDROID__)
        bool added_window_exts = check_add_window_ext("VK_KHR_android_surface");
#elif defined(_DIRECT2DISPLAY)
        bool added_window_exts = check_add_window_ext("VK_KHR_display");
#elif defined(__linux__) || defined(__FreeBSD__)
        // make sure all three calls to check_add_window_ext, don't allow short circuiting
        bool added_window_exts = check_add_window_ext("VK_KHR_xcb_surface");
        added_window_exts = check_add_window_ext("VK_KHR_xlib_surface") || added_window_exts;
        added_window_exts = check_add_window_ext("VK_KHR_wayland_surface") || added_window_exts;
#elif defined(__APPLE__)
        bool added_window_exts = check_add_window_ext("VK_EXT_metal_surface");
#endif
        if (!khr_surface_added || !added_window_exts)
            return make_error_code(InstanceError::windowing_extensions_not_present);
    }
    bool all_extensions_supported = detail::check_extensions_supported(system.available_extensions, extensions);
    if (!all_extensions_supported) {
        return make_error_code(InstanceError::requested_extensions_not_present);
    }

    for (auto& layer : info.layers)
        layers.push_back(layer);

    if (info.enable_validation_layers || (info.request_validation_layers && system.validation_layers_available)) {
        layers.push_back(detail::validation_layer_name);
    }
    bool all_layers_supported = detail::check_layers_supported(system.available_layers, layers);
    if (!all_layers_supported) {
        return make_error_code(InstanceError::requested_layers_not_present);
    }

    std::vector<VkBaseOutStructure*> pNext_chain;

    VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo = {};
    if (info.use_debug_messenger) {
        messengerCreateInfo.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        messengerCreateInfo.pNext = nullptr;
        messengerCreateInfo.messageSeverity = info.debug_message_severity;
        messengerCreateInfo.messageType = info.debug_message_type;
        messengerCreateInfo.pfnUserCallback = info.debug_callback;
        messengerCreateInfo.pUserData = info.debug_user_data_pointer;
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&messengerCreateInfo));
    }

    VkValidationFeaturesEXT features{};
    if (info.enabled_validation_features.size() != 0 || info.disabled_validation_features.size()) {
        features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
        features.pNext = nullptr;
        features.enabledValidationFeatureCount = static_cast<uint32_t>(info.enabled_validation_features.size());
        features.pEnabledValidationFeatures = info.enabled_validation_features.data();
        features.disabledValidationFeatureCount = static_cast<uint32_t>(info.disabled_validation_features.size());
        features.pDisabledValidationFeatures = info.disabled_validation_features.data();
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features));
    }

    VkValidationFlagsEXT checks{};
    if (info.disabled_validation_checks.size() != 0) {
        checks.sType = VK_STRUCTURE_TYPE_VALIDATION_FLAGS_EXT;
        checks.pNext = nullptr;
        checks.disabledValidationCheckCount = static_cast<uint32_t>(info.disabled_validation_checks.size());
        checks.pDisabledValidationChecks = info.disabled_validation_checks.data();
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&checks));
    }

    VkInstanceCreateInfo instance_create_info = {};
    instance_create_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    detail::setup_pNext_chain(instance_create_info, pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    instance_create_info.flags = info.flags;
    instance_create_info.pApplicationInfo = &app_info;
    instance_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions.size());
    instance_create_info.ppEnabledExtensionNames = extensions.data();
    instance_create_info.enabledLayerCount = static_cast<uint32_t>(layers.size());
    instance_create_info.ppEnabledLayerNames = layers.data();
#if defined(VK_KHR_portability_enumeration)
    if (portability_enumeration_support) {
        instance_create_info.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
#endif

    Instance instance;
    VkResult res =
        detail::vulkan_functions().fp_vkCreateInstance(&instance_create_info, info.allocation_callbacks, &instance.instance);
    if (res != VK_SUCCESS) return Result<Instance>(InstanceError::failed_create_instance, res);

    detail::vulkan_functions().init_instance_funcs(instance.instance);

    if (info.use_debug_messenger) {
        res = create_debug_utils_messenger(instance.instance,
            info.debug_callback,
            info.debug_message_severity,
            info.debug_message_type,
            info.debug_user_data_pointer,
            &instance.debug_messenger,
            info.allocation_callbacks);
        if (res != VK_SUCCESS) {
            return Result<Instance>(InstanceError::failed_create_debug_messenger, res);
        }
    }

    instance.headless = info.headless_context;
    instance.properties2_ext_enabled = properties2_ext_enabled;
    instance.allocation_callbacks = info.allocation_callbacks;
    instance.instance_version = instance_version;
    instance.api_version = api_version;
    instance.fp_vkGetInstanceProcAddr = detail::vulkan_functions().ptr_vkGetInstanceProcAddr;
    instance.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    return instance;
}